

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinitionRewriting.cpp
# Opt level: O2

Clause * performRewriting(Clause *rwClause,Literal *rwLit,TermList rwTerm,Clause *eqClause,
                         Literal *eqLit,TermList eqLHS,ResultSubstitutionSP *subst,
                         DemodulationHelper *helper,bool *isEqTautology,Inference *inf)

{
  bool bVar1;
  int iVar2;
  TermList TVar3;
  undefined4 extraout_var;
  Literal *pLVar4;
  Literal **ppLVar5;
  undefined4 extraout_var_00;
  Literal **ppLVar6;
  Clause *pCVar7;
  uint uVar8;
  uint uVar9;
  Applicator appl;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_a0;
  Clause *local_90;
  TermList local_88;
  Literal *local_80;
  SubstApplicator local_78;
  ResultSubstitution *local_70;
  Inference local_68;
  
  local_90 = eqClause;
  local_80 = eqLit;
  TVar3 = Kernel::EqHelper::getOtherEqualitySide(eqLit,eqLHS);
  TVar3._content._0_4_ = (*subst->_obj->_vptr_ResultSubstitution[0xf])(subst->_obj,TVar3._content);
  TVar3._content._4_4_ = extraout_var;
  local_70 = subst->_obj;
  local_78._vptr_SubstApplicator = (_func_int **)&PTR__SubstApplicator_009fac60;
  if ((helper == (DemodulationHelper *)0x0) ||
     (bVar1 = Inferences::DemodulationHelper::isPremiseRedundant
                        (helper,rwClause,rwLit,rwTerm,TVar3,eqLHS,&local_78), bVar1)) {
    pLVar4 = Kernel::EqHelper::replace(rwLit,rwTerm,TVar3);
    bVar1 = Kernel::EqHelper::isEqTautology(pLVar4);
    if (!bVar1) {
      local_88._content = rwTerm._content;
      Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      Recycled(&local_a0);
      Lib::Stack<Kernel::Literal_*>::push
                ((Stack<Kernel::Literal_*> *)
                 local_a0._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,pLVar4)
      ;
      uVar8 = *(uint *)&rwClause->field_0x38 & 0xfffff;
      uVar9 = (uint)(uVar8 != 0);
      ppLVar5 = (Literal **)0x0;
      if (uVar8 != 0) {
        ppLVar5 = rwClause->_literals;
      }
      while (ppLVar5 != (Literal **)0x0) {
        if (*ppLVar5 != rwLit) {
          pLVar4 = Kernel::EqHelper::replace(*ppLVar5,local_88,TVar3);
          bVar1 = Kernel::EqHelper::isEqTautology(pLVar4);
          if (bVar1) goto LAB_003efe8b;
          Lib::Stack<Kernel::Literal_*>::push
                    ((Stack<Kernel::Literal_*> *)
                     local_a0._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                     pLVar4);
        }
        ppLVar5 = rwClause->_literals + (int)uVar9;
        if (uVar8 <= uVar9) {
          ppLVar5 = (Literal **)0x0;
        }
        uVar9 = uVar9 + (uVar9 < uVar8);
      }
      ppLVar5 = local_90->_literals;
      uVar9 = *(uint *)&local_90->field_0x38 & 0xfffff;
      uVar8 = (uint)(uVar9 != 0);
      ppLVar6 = (Literal **)0x0;
      if (uVar9 != 0) {
        ppLVar6 = ppLVar5;
      }
      while (ppLVar6 != (Literal **)0x0) {
        if (*ppLVar6 != local_80) {
          iVar2 = (*subst->_obj->_vptr_ResultSubstitution[0x10])();
          bVar1 = Kernel::EqHelper::isEqTautology((Literal *)CONCAT44(extraout_var_00,iVar2));
          if (bVar1) goto LAB_003efe8b;
          Lib::Stack<Kernel::Literal_*>::push
                    ((Stack<Kernel::Literal_*> *)
                     local_a0._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                     (Literal *)CONCAT44(extraout_var_00,iVar2));
        }
        ppLVar6 = ppLVar5 + (int)uVar8;
        if (uVar9 <= uVar8) {
          ppLVar6 = (Literal **)0x0;
        }
        uVar8 = uVar8 + (uVar8 < uVar9);
      }
      local_68._0_8_ = *(undefined8 *)inf;
      local_68._8_4_ = *(undefined4 *)&inf->field_0x8;
      local_68._age = inf->_age;
      local_68._splits = inf->_splits;
      local_68._ptr1 = inf->_ptr1;
      local_68._ptr2 = inf->_ptr2;
      local_68.th_ancestors = inf->th_ancestors;
      local_68.all_ancestors = inf->all_ancestors;
      pCVar7 = Kernel::Clause::fromStack
                         ((Stack<Kernel::Literal_*> *)
                          local_a0._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl,&local_68);
      goto LAB_003efeca;
    }
    *isEqTautology = true;
  }
  return (Clause *)0x0;
LAB_003efe8b:
  *isEqTautology = true;
  pCVar7 = (Clause *)0x0;
LAB_003efeca:
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_a0);
  return pCVar7;
}

Assistant:

Clause* performRewriting(
    Clause *rwClause, Literal *rwLit, TermList rwTerm, Clause *eqClause,
    Literal *eqLit, TermList eqLHS, ResultSubstitutionSP subst,
    DemodulationHelper* helper, bool& isEqTautology, Inference&& inf)
{
  ASS(!eqLHS.isVar());

  TermList tgtTerm = EqHelper::getOtherEqualitySide(eqLit, eqLHS);

  // This should be the case for code trees
  ASS(subst->isIdentityOnQueryWhenResultBound());
  TermList tgtTermS = subst->applyToBoundResult(tgtTerm);

  Applicator appl(subst.ptr());

  if (helper && !helper->isPremiseRedundant(rwClause,rwLit,rwTerm,tgtTermS,eqLHS,&appl)) {
    return 0;
  }

  Literal *tgtLitS = EqHelper::replace(rwLit, rwTerm, tgtTermS);
  if (EqHelper::isEqTautology(tgtLitS)) {
    isEqTautology = true;
    return 0;
  }

  RStack<Literal*> resLits;

  resLits->push(tgtLitS);

  for (Literal *curr : rwClause->iterLits()) {
    if (curr == rwLit) {
      continue;
    }
    curr = EqHelper::replace(curr, rwTerm, tgtTermS);

    if (EqHelper::isEqTautology(curr)) {
      isEqTautology = true;
      return nullptr;
    }

    resLits->push(curr);
  }

  for (Literal* curr : eqClause->iterLits()) {
    if (curr == eqLit) {
      continue;
    }
    Literal* currAfter = subst->applyToBoundResult(curr);

    if (EqHelper::isEqTautology(currAfter)) {
      isEqTautology = true;
      return nullptr;
    }

    resLits->push(currAfter);
  }

  return Clause::fromStack(*resLits, inf);
}